

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShape.cpp
# Opt level: O1

void __thiscall chrono::ChVisualShape::SetOpacity(ChVisualShape *this,float val)

{
  vector<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
  *this_00;
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined1 local_49;
  shared_ptr<chrono::ChVisualMaterial> local_48;
  float local_34;
  ChVisualMaterial *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  this_00 = &this->material_list;
  psVar1 = (this->material_list).
           super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_34 = val;
  if (psVar1 == (this->material_list).
                super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    ChVisualMaterial::Default();
    local_48.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChVisualMaterial,std::allocator<chrono::ChVisualMaterial>,chrono::ChVisualMaterial&>
              (&local_48.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(ChVisualMaterial **)&local_48,
               (allocator<chrono::ChVisualMaterial> *)&local_49,local_30);
    std::
    vector<std::shared_ptr<chrono::ChVisualMaterial>,std::allocator<std::shared_ptr<chrono::ChVisualMaterial>>>
    ::emplace_back<std::shared_ptr<chrono::ChVisualMaterial>>
              ((vector<std::shared_ptr<chrono::ChVisualMaterial>,std::allocator<std::shared_ptr<chrono::ChVisualMaterial>>>
                *)this_00,&local_48);
  }
  else {
    ChVisualMaterial::Default();
    peVar3 = local_48.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar2 = (psVar1->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (local_48.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (peVar2 != peVar3) goto LAB_00846373;
    ChVisualMaterial::Default();
    local_48.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChVisualMaterial,std::allocator<chrono::ChVisualMaterial>,chrono::ChVisualMaterial&>
              (&local_48.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(ChVisualMaterial **)&local_48,
               (allocator<chrono::ChVisualMaterial> *)&local_49,local_30);
    _Var4._M_pi = local_48.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar2 = local_48.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    psVar1 = (this_00->
             super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_48.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = (psVar1->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    (psVar1->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         peVar2;
    (psVar1->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
    _M_pi = _Var4._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  if (local_48.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
LAB_00846373:
  ChVisualMaterial::SetOpacity
            ((((this_00->
               super__Vector_base<std::shared_ptr<chrono::ChVisualMaterial>,_std::allocator<std::shared_ptr<chrono::ChVisualMaterial>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             local_34);
  return;
}

Assistant:

void ChVisualShape::SetOpacity(float val) {
    // Ensure that material_list[0] is a new material
    if (material_list.empty())
        material_list.push_back(std::make_shared<ChVisualMaterial>(*ChVisualMaterial::Default()));
    else if (material_list[0] == ChVisualMaterial::Default())
        material_list[0] = std::make_shared<ChVisualMaterial>(*ChVisualMaterial::Default());

    material_list[0]->SetOpacity(val);
}